

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

void __thiscall
cmCustomCommandGenerator::cmCustomCommandGenerator
          (cmCustomCommandGenerator *this,cmCustomCommand *cc,string *config,cmLocalGenerator *lg)

{
  pointer *ppbVar1;
  cmLocalGenerator *pcVar2;
  pointer this_00;
  bool bVar3;
  cmGeneratorExpression *this_01;
  cmListFileBacktrace *pcVar4;
  vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *this_02;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  iterator iVar5;
  iterator iVar6;
  ulong uVar7;
  pointer pcVar8;
  string *psVar9;
  string local_290;
  string *local_270;
  string *build_dir;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  cge_2;
  string *workingdirectory;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_220;
  const_iterator local_218;
  string local_210;
  string *local_1f0;
  string *it;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  undefined1 local_1b0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  cge_1;
  string *d;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_120;
  const_iterator local_118;
  undefined1 local_110 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ExpandedArg;
  undefined1 local_d8 [8];
  string parsed_arg;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string *clarg;
  const_iterator __end2;
  const_iterator __begin2;
  cmCustomCommandLine *__range2;
  cmCustomCommandLine argv;
  cmCustomCommandLine *cmdline;
  const_iterator __end1;
  const_iterator __begin1;
  cmCustomCommandLines *__range1;
  cmCustomCommandLines *cmdlines;
  cmListFileBacktrace local_48 [2];
  cmLocalGenerator *local_28;
  cmLocalGenerator *lg_local;
  string *config_local;
  cmCustomCommand *cc_local;
  cmCustomCommandGenerator *this_local;
  
  this->CC = cc;
  local_28 = lg;
  lg_local = (cmLocalGenerator *)config;
  config_local = (string *)cc;
  cc_local = (cmCustomCommand *)this;
  std::__cxx11::string::string((string *)&this->Config,(string *)config);
  this->LG = local_28;
  bVar3 = cmCustomCommand::GetEscapeOldStyle((cmCustomCommand *)config_local);
  this->OldStyle = bVar3;
  bVar3 = cmCustomCommand::GetEscapeAllowMakeVars((cmCustomCommand *)config_local);
  this->MakeVars = bVar3;
  this_01 = (cmGeneratorExpression *)operator_new(0x10);
  pcVar4 = cmCustomCommand::GetBacktrace((cmCustomCommand *)config_local);
  cmListFileBacktrace::cmListFileBacktrace(local_48,pcVar4);
  cmGeneratorExpression::cmGeneratorExpression(this_01,local_48);
  cmListFileBacktrace::~cmListFileBacktrace(local_48);
  this->GE = this_01;
  cmCustomCommandLines::cmCustomCommandLines(&this->CommandLines);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Depends);
  std::__cxx11::string::string((string *)&this->WorkingDirectory);
  this_02 = &cmCustomCommand::GetCommandLines(this->CC)->
             super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>;
  __end1 = std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::begin(this_02);
  cmdline = (cmCustomCommandLine *)
            std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::end(this_02);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
                                     *)&cmdline), bVar3) {
    argv.
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
                  ::operator*(&__end1);
    cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)&__range2);
    this_00 = argv.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)argv.
                        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    clarg = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&clarg), bVar3) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&__end2);
      cmGeneratorExpression::Parse
                ((cmGeneratorExpression *)((long)&parsed_arg.field_2 + 8),(string *)this->GE);
      pcVar8 = std::
               unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                             *)((long)&parsed_arg.field_2 + 8));
      pcVar2 = this->LG;
      ppbVar1 = &ExpandedArg.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::string((string *)ppbVar1);
      psVar9 = cmCompiledGeneratorExpression::Evaluate
                         (pcVar8,pcVar2,&this->Config,false,(cmGeneratorTarget *)0x0,
                          (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                          (string *)ppbVar1);
      std::__cxx11::string::string((string *)local_d8,(string *)psVar9);
      std::__cxx11::string::~string
                ((string *)
                 &ExpandedArg.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar3 = cmCustomCommand::GetCommandExpandLists(this->CC);
      if (bVar3) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_110);
        cmSystemTools::ExpandListArgument
                  ((string *)local_d8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_110,false);
        local_120._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_118,&local_120);
        iVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_110);
        iVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_110);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range2,
                   local_118,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )iVar5._M_current,
                   (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    )iVar6._M_current);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_110);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2,(value_type *)local_d8);
      }
      std::__cxx11::string::~string((string *)local_d8);
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)((long)&parsed_arg.field_2 + 8));
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    bVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&__range2);
    if (bVar3) {
      ppbVar1 = &depends.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::string((string *)ppbVar1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range2,(value_type *)ppbVar1);
      std::__cxx11::string::~string
                ((string *)
                 &depends.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
              (&(this->CommandLines).
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
               (value_type *)&__range2);
    cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)&__range2);
    __gnu_cxx::
    __normal_iterator<const_cmCustomCommandLine_*,_std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>_>
    ::operator++(&__end1);
  }
  __x = cmCustomCommand::GetDepends_abi_cxx11_(this->CC);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1_1,__x);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range1_1);
  d = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1_1);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&d), bVar3) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&__end1_1);
    cmGeneratorExpression::Parse
              ((cmGeneratorExpression *)
               &result.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)this->GE);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1b0);
    pcVar8 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)&result.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pcVar2 = this->LG;
    std::__cxx11::string::string((string *)&__range2_1);
    psVar9 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar8,pcVar2,&this->Config,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                        (string *)&__range2_1);
    cmSystemTools::ExpandListArgument
              (psVar9,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_1b0,false);
    std::__cxx11::string::~string((string *)&__range2_1);
    __end2_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1b0);
    it = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1b0);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&it), bVar3) {
      local_1f0 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_1);
      bVar3 = cmsys::SystemTools::FileIsFullPath(local_1f0);
      if (bVar3) {
        cmsys::SystemTools::CollapseFullPath(&local_210,local_1f0);
        std::__cxx11::string::operator=((string *)local_1f0,(string *)&local_210);
        std::__cxx11::string::~string((string *)&local_210);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_1);
    }
    local_220._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->Depends);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_218,&local_220);
    iVar5 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_1b0);
    iVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_1b0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Depends,
               local_218,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )iVar5._M_current,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )iVar6._M_current);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1b0);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&result.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  cge_2._M_t.
  super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
       (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
        )cmCustomCommand::GetWorkingDirectory_abi_cxx11_(this->CC);
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    cmGeneratorExpression::Parse
              ((cmGeneratorExpression *)&stack0xfffffffffffffdb8,(string *)this->GE);
    pcVar8 = std::
             unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
             ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                           *)&stack0xfffffffffffffdb8);
    pcVar2 = this->LG;
    std::__cxx11::string::string((string *)&build_dir);
    psVar9 = cmCompiledGeneratorExpression::Evaluate
                       (pcVar8,pcVar2,&this->Config,false,(cmGeneratorTarget *)0x0,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                        (string *)&build_dir);
    std::__cxx11::string::operator=((string *)&this->WorkingDirectory,(string *)psVar9);
    std::__cxx11::string::~string((string *)&build_dir);
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      local_270 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_(this->LG);
      cmsys::SystemTools::CollapseFullPath(&local_290,&this->WorkingDirectory,local_270);
      std::__cxx11::string::operator=((string *)&this->WorkingDirectory,(string *)&local_290);
      std::__cxx11::string::~string((string *)&local_290);
    }
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&stack0xfffffffffffffdb8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1_1);
  return;
}

Assistant:

cmCustomCommandGenerator::cmCustomCommandGenerator(cmCustomCommand const& cc,
                                                   std::string config,
                                                   cmLocalGenerator* lg)
  : CC(cc)
  , Config(std::move(config))
  , LG(lg)
  , OldStyle(cc.GetEscapeOldStyle())
  , MakeVars(cc.GetEscapeAllowMakeVars())
  , GE(new cmGeneratorExpression(cc.GetBacktrace()))
{
  const cmCustomCommandLines& cmdlines = this->CC.GetCommandLines();
  for (cmCustomCommandLine const& cmdline : cmdlines) {
    cmCustomCommandLine argv;
    for (std::string const& clarg : cmdline) {
      std::unique_ptr<cmCompiledGeneratorExpression> cge =
        this->GE->Parse(clarg);
      std::string parsed_arg = cge->Evaluate(this->LG, this->Config);
      if (this->CC.GetCommandExpandLists()) {
        std::vector<std::string> ExpandedArg;
        cmSystemTools::ExpandListArgument(parsed_arg, ExpandedArg);
        argv.insert(argv.end(), ExpandedArg.begin(), ExpandedArg.end());
      } else {
        argv.push_back(std::move(parsed_arg));
      }
    }

    // Later code assumes at least one entry exists, but expanding
    // lists on an empty command may have left this empty.
    // FIXME: Should we define behavior for removing empty commands?
    if (argv.empty()) {
      argv.push_back(std::string());
    }

    this->CommandLines.push_back(std::move(argv));
  }

  std::vector<std::string> depends = this->CC.GetDepends();
  for (std::string const& d : depends) {
    std::unique_ptr<cmCompiledGeneratorExpression> cge = this->GE->Parse(d);
    std::vector<std::string> result;
    cmSystemTools::ExpandListArgument(cge->Evaluate(this->LG, this->Config),
                                      result);
    for (std::string& it : result) {
      if (cmSystemTools::FileIsFullPath(it)) {
        it = cmSystemTools::CollapseFullPath(it);
      }
    }
    this->Depends.insert(this->Depends.end(), result.begin(), result.end());
  }

  const std::string& workingdirectory = this->CC.GetWorkingDirectory();
  if (!workingdirectory.empty()) {
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      this->GE->Parse(workingdirectory);
    this->WorkingDirectory = cge->Evaluate(this->LG, this->Config);
    // Convert working directory to a full path.
    if (!this->WorkingDirectory.empty()) {
      std::string const& build_dir = this->LG->GetCurrentBinaryDirectory();
      this->WorkingDirectory =
        cmSystemTools::CollapseFullPath(this->WorkingDirectory, build_dir);
    }
  }
}